

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

DenseSetPair<llvm::DWARFDebugNames::Abbrev> * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::InsertIntoBucketImpl<llvm::DWARFDebugNames::Abbrev>
          (DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
           *this,Abbrev *Key,Abbrev *Lookup,DenseSetPair<llvm::DWARFDebugNames::Abbrev> *TheBucket)

{
  pointer pAVar1;
  uint AtLeast;
  Index local_48;
  Abbrev EmptyKey;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *TheBucket_local;
  
  AtLeast = *(uint *)(this + 0x10);
  EmptyKey.Attributes.
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)TheBucket;
  if (*(uint *)(this + 8) * 4 + 4 < AtLeast * 3) {
    if (AtLeast >> 3 < (~*(uint *)(this + 8) + AtLeast) - *(int *)(this + 0xc)) goto LAB_00b1ffc7;
  }
  else {
    AtLeast = AtLeast * 2;
  }
  DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
  ::grow((DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
          *)this,AtLeast);
  LookupBucketFor<llvm::DWARFDebugNames::Abbrev>
            (this,Lookup,
             (DenseSetPair<llvm::DWARFDebugNames::Abbrev> **)
             &EmptyKey.Attributes.
              super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00b1ffc7:
  if (EmptyKey.Attributes.
      super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    *(int *)(this + 8) = *(int *)(this + 8) + 1;
    sentinelAbbrev();
    pAVar1 = EmptyKey.Attributes.
             super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((EmptyKey.Attributes.
         super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)->Index != local_48) {
      *(int *)(this + 0xc) = *(int *)(this + 0xc) + -1;
    }
    std::
    _Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
    ::~_Vector_base((_Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                     *)&EmptyKey);
    return (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)pAVar1;
  }
  __assert_fail("TheBucket",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x22f,
                "BucketT *llvm::DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, KeyT = llvm::DWARFDebugNames::Abbrev, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DWARFDebugNames::AbbrevMapInfo, BucketT = llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>, LookupKeyT = llvm::DWARFDebugNames::Abbrev]"
               );
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }